

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4faa5c::FunctionType::printRight(FunctionType *this,OutputStream *S)

{
  Qualifiers QVar1;
  char *pcVar2;
  char *pcVar3;
  StringView R;
  StringView R_00;
  StringView R_01;
  StringView R_02;
  StringView R_03;
  StringView R_04;
  
  R.Last = "";
  R.First = "(";
  OutputStream::operator+=(S,R);
  NodeArray::printWithComma(&this->Params,S);
  R_00.Last = "";
  R_00.First = ")";
  OutputStream::operator+=(S,R_00);
  (*this->Ret->_vptr_Node[5])(this->Ret,S);
  QVar1 = this->CVQuals;
  if ((QVar1 & QualConst) != QualNone) {
    R_01.Last = "";
    R_01.First = " const";
    OutputStream::operator+=(S,R_01);
    QVar1 = this->CVQuals;
  }
  if ((QVar1 & QualVolatile) != QualNone) {
    R_02.Last = "";
    R_02.First = " volatile";
    OutputStream::operator+=(S,R_02);
    QVar1 = this->CVQuals;
  }
  if ((QVar1 & QualRestrict) != QualNone) {
    R_03.Last = "";
    R_03.First = " restrict";
    OutputStream::operator+=(S,R_03);
  }
  if (this->RefQual == FrefQualRValue) {
    pcVar3 = " &&";
    pcVar2 = "";
  }
  else {
    if (this->RefQual != FrefQualLValue) goto LAB_001b84b2;
    pcVar3 = " &";
    pcVar2 = "";
  }
  R_04.Last = pcVar2;
  R_04.First = pcVar3;
  OutputStream::operator+=(S,R_04);
LAB_001b84b2:
  if (this->ExceptionSpec != (Node *)0x0) {
    OutputStream::operator+=(S,' ');
    Node::print(this->ExceptionSpec,S);
    return;
  }
  return;
}

Assistant:

void printRight(OutputStream &S) const override {
    S += "(";
    Params.printWithComma(S);
    S += ")";
    Ret->printRight(S);

    if (CVQuals & QualConst)
      S += " const";
    if (CVQuals & QualVolatile)
      S += " volatile";
    if (CVQuals & QualRestrict)
      S += " restrict";

    if (RefQual == FrefQualLValue)
      S += " &";
    else if (RefQual == FrefQualRValue)
      S += " &&";

    if (ExceptionSpec != nullptr) {
      S += ' ';
      ExceptionSpec->print(S);
    }
  }